

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O0

void vkt::sr::anon_unknown_0::evalTexture1DArrayGrad(ShaderEvalContext *c,TexLookupParams *p)

{
  float s;
  float t;
  float *pfVar1;
  float lod;
  Vector<float,_4> local_48;
  Vector<float,_4> local_38;
  undefined8 local_28;
  undefined8 local_20;
  TexLookupParams *local_18;
  TexLookupParams *p_local;
  ShaderEvalContext *c_local;
  
  local_18 = p;
  p_local = (TexLookupParams *)c;
  pfVar1 = tcu::Vector<float,_4>::x(c->in);
  s = *pfVar1;
  pfVar1 = tcu::Vector<float,_4>::y((Vector<float,_4> *)(p_local + 1));
  t = *pfVar1;
  lod = computeLodFromGrad1DArray((ShaderEvalContext *)p_local);
  texture1DArray((anon_unknown_0 *)&local_48,c,s,t,lod);
  tcu::operator*((tcu *)&local_38,&local_48,&local_18->scale);
  tcu::operator+((tcu *)&local_28,&local_38,&local_18->bias);
  *(undefined8 *)p_local[0xc].scale.m_data = local_28;
  *(undefined8 *)(p_local[0xc].scale.m_data + 2) = local_20;
  return;
}

Assistant:

static void		evalTexture1DArrayGrad		(ShaderEvalContext& c, const TexLookupParams& p)	{ c.color = texture1DArray(c, c.in[0].x(), c.in[0].y(), computeLodFromGrad1DArray(c))*p.scale + p.bias; }